

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_io.cc
# Opt level: O0

int __thiscall comp_io_buf::open_file(comp_io_buf *this,char *name,bool stdin_off,int flag)

{
  int iVar1;
  size_type sVar2;
  ostream *this_00;
  int in_ECX;
  byte in_DL;
  char *in_RSI;
  v_array<int> *in_RDI;
  int ret;
  gzFile fil;
  int *in_stack_ffffffffffffffc8;
  int iVar3;
  vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *pvVar4;
  
  pvVar4 = (vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)0x0;
  iVar3 = -1;
  if (in_ECX == 1) {
    if (*in_RSI == '\0') {
      if ((in_DL & 1) == 0) {
        iVar1 = fileno(_stdin);
        pvVar4 = (vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)gzdopen(iVar1,"rb");
      }
    }
    else {
      pvVar4 = (vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)gzopen64(in_RSI,"rb");
    }
    if (pvVar4 != (vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)0x0) {
      std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::push_back
                (pvVar4,(value_type *)CONCAT44(iVar3,in_ECX));
      sVar2 = std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::size
                        ((vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)&in_RDI[5]._end);
      iVar3 = (int)sVar2 + -1;
      v_array<int>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    }
  }
  else if (in_ECX == 2) {
    pvVar4 = (vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)gzopen64(in_RSI,"wb");
    if (pvVar4 != (vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)0x0) {
      std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::push_back
                (pvVar4,(value_type *)CONCAT44(iVar3,in_ECX));
      sVar2 = std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::size
                        ((vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)&in_RDI[5]._end);
      iVar3 = (int)sVar2 + -1;
      v_array<int>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Unknown file operation. Something other than READ/WRITE specified");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return iVar3;
}

Assistant:

int comp_io_buf::open_file(const char* name, bool stdin_off, int flag)
{
  gzFile fil = nullptr;
  int ret = -1;
  switch (flag)
  {
    case READ:
      if (*name != '\0')
        fil = gzopen(name, "rb");
      else if (!stdin_off)
#ifdef _WIN32
        fil = gzdopen(_fileno(stdin), "rb");
#else
        fil = gzdopen(fileno(stdin), "rb");
#endif
      if (fil != nullptr)
      {
        gz_files.push_back(fil);
        ret = (int)gz_files.size() - 1;
        files.push_back(ret);
      }
      break;

    case WRITE:
      fil = gzopen(name, "wb");
      if (fil != nullptr)
      {
        gz_files.push_back(fil);
        ret = (int)gz_files.size() - 1;
        files.push_back(ret);
      }
      break;

    default:
      std::cerr << "Unknown file operation. Something other than READ/WRITE specified" << std::endl;
  }
  return ret;
}